

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int thread_idle_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                   size_t newlen)

{
  atomic_p_t arena;
  int iVar1;
  arena_t *local_20;
  
  iVar1 = 1;
  if (((oldp == (void *)0x0 && oldlenp == (size_t *)0x0) && newp == (void *)0x0) && newlen == 0) {
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true) {
      duckdb_je_tcache_flush(tsd);
    }
    iVar1 = 0;
    if (duckdb_je_ncpus * 2 < duckdb_je_opt_narenas) {
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
        arena.repr = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena;
        if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena == (arena_t *)0x0) {
          thread_idle_ctl_cold_1();
          arena.repr = local_20;
        }
      }
      else {
        arena.repr = duckdb_je_arenas[0].repr;
        if (duckdb_je_arenas[0].repr == (void *)0x0) {
          arena.repr = duckdb_je_arena_init((tsdn_t *)tsd,0,&duckdb_je_arena_config_default);
        }
      }
      iVar1 = 0;
      if ((arena_t *)arena.repr != (arena_t *)0x0) {
        iVar1 = 0;
        duckdb_je_arena_decay((tsdn_t *)tsd,(arena_t *)arena.repr,false,true);
      }
    }
  }
  return iVar1;
}

Assistant:

static int
thread_idle_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen) {
	int ret;

	NEITHER_READ_NOR_WRITE();

	if (tcache_available(tsd)) {
		tcache_flush(tsd);
	}
	/*
	 * This heuristic is perhaps not the most well-considered.  But it
	 * matches the only idling policy we have experience with in the status
	 * quo.  Over time we should investigate more principled approaches.
	 */
	if (opt_narenas > ncpus * 2) {
		arena_t *arena = arena_choose(tsd, NULL);
		if (arena != NULL) {
			arena_decay(tsd_tsdn(tsd), arena, false, true);
		}
		/*
		 * The missing arena case is not actually an error; a thread
		 * might be idle before it associates itself to one.  This is
		 * unusual, but not wrong.
		 */
	}

	ret = 0;
label_return:
	return ret;
}